

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncTask.cpp
# Opt level: O0

int nite::AsyncTask::init(EVP_PKEY_CTX *ctx)

{
  int iVar1;
  size_type sVar2;
  __shared_ptr<nite::AsyncTask::Context,_(__gnu_cxx::_Lock_policy)2> *this;
  element_type *this_00;
  element_type *task;
  int i;
  
  iVar1 = pthread_mutex_init((pthread_mutex_t *)&asyncTaskMutex,(pthread_mutexattr_t *)0x0);
  if (iVar1 != 0) {
    iVar1 = 0x36eb5a;
    print("failed to start mutex");
    exit(iVar1);
  }
  iVar1 = pthread_mutex_init((pthread_mutex_t *)&uniqueIdMutex,(pthread_mutexattr_t *)0x0);
  if (iVar1 != 0) {
    iVar1 = 0x36eb5a;
    print("failed to start mutex");
    exit(iVar1);
  }
  pthread_mutex_lock((pthread_mutex_t *)&asyncTaskMutex);
  task._4_4_ = 0;
  while( true ) {
    sVar2 = std::
            vector<std::shared_ptr<nite::AsyncTask::Context>,_std::allocator<std::shared_ptr<nite::AsyncTask::Context>_>_>
            ::size(&pool);
    if (sVar2 <= (ulong)(long)task._4_4_) break;
    this = &std::
            vector<std::shared_ptr<nite::AsyncTask::Context>,_std::allocator<std::shared_ptr<nite::AsyncTask::Context>_>_>
            ::operator[](&pool,(long)task._4_4_)->
            super___shared_ptr<nite::AsyncTask::Context,_(__gnu_cxx::_Lock_policy)2>;
    this_00 = std::__shared_ptr<nite::AsyncTask::Context,_(__gnu_cxx::_Lock_policy)2>::get(this);
    Context::stop(this_00);
    task._4_4_ = task._4_4_ + 1;
  }
  iVar1 = pthread_mutex_unlock((pthread_mutex_t *)&asyncTaskMutex);
  return iVar1;
}

Assistant:

void  nite::AsyncTask::init(){
    if(pthread_mutex_init(&asyncTaskMutex, NULL) != 0){ 
        nite::print("failed to start mutex");
        nite::exit();
    }  
    if(pthread_mutex_init(&uniqueIdMutex, NULL) != 0){ 
        nite::print("failed to start mutex");
        nite::exit();
    } 		
	pthread_mutex_lock(&asyncTaskMutex);
	for(int i = 0; i < pool.size(); ++i){
		auto task = pool[i].get();
		task->stop();
	}	
	pthread_mutex_unlock(&asyncTaskMutex);
}